

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  unkbyte10 Var2;
  char cVar3;
  complex<long_double> **ppcVar4;
  complex<long_double> *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  list<long,_std::allocator<long>_> *plVar10;
  int iVar11;
  uint uVar12;
  int extraout_var;
  long lVar13;
  _List_node_base *p_Var14;
  ostream *poVar15;
  ulong uVar16;
  _List_node_base *p_Var17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  _List_node_base *p_Var21;
  long lVar22;
  long lVar23;
  complex<long_double> *pcVar24;
  complex<long_double> *pcVar25;
  _List_node_base *p_Var26;
  longdouble in_ST0;
  longdouble lVar27;
  longdouble in_ST1;
  longdouble lVar28;
  longdouble lVar29;
  longdouble lVar30;
  longdouble in_ST2;
  longdouble lVar31;
  longdouble lVar32;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r;
  complex<long_double> local_138;
  longdouble local_114;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined8 local_f8;
  undefined2 uStack_f0;
  undefined4 uStack_ee;
  undefined2 uStack_ea;
  list<long,_std::allocator<long>_> *local_e8;
  longdouble local_dc;
  _List_node_base *local_d0;
  TPZSkylMatrix<std::complex<long_double>_> *local_c8;
  _List_node_base *local_c0;
  long local_b8;
  long local_b0;
  complex<long_double> *local_a8;
  long local_a0;
  _List_node_base *local_98;
  long local_90;
  undefined1 local_88 [36];
  longdouble local_64;
  undefined1 local_58 [40];
  
  cVar3 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed;
  local_e8 = singular;
  if (cVar3 != '\0') {
    if (cVar3 == '\x03') {
      return 1;
    }
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<long double>>::Decompose_Cholesky(std::list<int64_t> &) [TVar = std::complex<long double>]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(local_e8);
  lVar31 = (longdouble)0;
  local_108 = SUB104(lVar31,0);
  uStack_104 = (undefined4)((unkuint10)lVar31 >> 0x20);
  uStack_100 = (undefined2)((unkuint10)lVar31 >> 0x40);
  local_f8 = SUB108(lVar31,0);
  uStack_f0 = uStack_100;
  iVar11 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable[0xc])(this);
  p_Var17 = (_List_node_base *)CONCAT44(extraout_var,iVar11);
  if (p_Var17 != (_List_node_base *)0x0 && -1 < extraout_var) {
    local_64 = (longdouble)1e-16;
    p_Var21 = (_List_node_base *)0x0;
    local_d0 = p_Var17;
    local_c8 = this;
    do {
      ppcVar4 = (this->fElem).fStore;
      lVar13 = (long)ppcVar4[(long)((long)&p_Var21->_M_next + 1)] - (long)ppcVar4[(long)p_Var21];
      if (lVar13 == 0) {
        return 0;
      }
      pcVar25 = (this->fElem).fStore[(long)p_Var21];
      local_a8 = (complex<long_double> *)((long)pcVar25 + lVar13);
      lVar31 = (longdouble)0;
      lVar28 = lVar31;
      lVar32 = in_ST0;
      lVar30 = in_ST1;
      lVar29 = in_ST2;
      if (0x20 < lVar13) {
        pcVar25 = pcVar25 + 1;
        lVar31 = (longdouble)0;
        lVar28 = lVar31;
        do {
          Var2 = *(unkbyte10 *)pcVar25->_M_value;
          lVar27 = -*(longdouble *)(pcVar25->_M_value + 0x10);
          local_138._M_value._0_4_ = SUB104(Var2,0);
          local_138._M_value._4_2_ = SUB102((unkuint10)Var2 >> 0x20,0);
          local_138._M_value._6_2_ = SUB102((unkuint10)Var2 >> 0x30,0);
          local_138._M_value._8_2_ = SUB102((unkuint10)Var2 >> 0x40,0);
          local_138._M_value._16_4_ = SUB104(lVar27,0);
          local_138._M_value._20_4_ = SUB104((unkuint10)lVar27 >> 0x20,0);
          local_138._M_value._24_2_ = SUB102((unkuint10)lVar27 >> 0x40,0);
          local_114 = lVar28;
          local_dc = lVar31;
          std::complex<long_double>::operator*=(&local_138,pcVar25);
          lVar31 = (longdouble)
                   CONCAT28(local_138._M_value._8_2_,
                            CONCAT26(local_138._M_value._6_2_,
                                     CONCAT24(local_138._M_value._4_2_,local_138._M_value._0_4_))) +
                   local_dc;
          lVar28 = (longdouble)
                   CONCAT28(local_138._M_value._24_2_,
                            CONCAT44(local_138._M_value._20_4_,local_138._M_value._16_4_)) +
                   local_114;
          pcVar25 = pcVar25 + 1;
        } while (pcVar25 < local_a8);
      }
      in_ST1 = in_ST4;
      in_ST0 = in_ST3;
      pcVar25 = (this->fElem).fStore[(long)p_Var21];
      lVar31 = *(longdouble *)pcVar25->_M_value - lVar31;
      lVar28 = *(longdouble *)(pcVar25->_M_value + 0x10) - lVar28;
      local_108 = SUB104(lVar31,0);
      uStack_104 = (undefined4)((unkuint10)lVar31 >> 0x20);
      uStack_100 = (undefined2)((unkuint10)lVar31 >> 0x40);
      uStack_fa = *(undefined2 *)(pcVar25->_M_value + 0xe);
      uStack_fe = (undefined2)*(undefined4 *)(pcVar25->_M_value + 10);
      uStack_fc = (undefined2)((uint)*(undefined4 *)(pcVar25->_M_value + 10) >> 0x10);
      local_f8 = SUB108(lVar28,0);
      uStack_f0 = (undefined2)((unkuint10)lVar28 >> 0x40);
      uStack_ee = *(undefined4 *)(pcVar25->_M_value + 0x1a);
      uStack_ea = *(undefined2 *)(pcVar25->_M_value + 0x1e);
      local_138._M_value._4_2_ = SUB102((unkuint10)lVar31 >> 0x20,0);
      local_138._M_value._6_2_ = SUB102((unkuint10)lVar31 >> 0x30,0);
      local_138._M_value._16_4_ = SUB104(lVar28,0);
      local_138._M_value._20_4_ = SUB104((unkuint10)lVar28 >> 0x20,0);
      in_ST2 = in_ST1;
      in_ST3 = in_ST1;
      local_138._M_value._0_4_ = local_108;
      local_138._M_value._8_2_ = uStack_100;
      local_138._M_value._24_2_ = uStack_f0;
      cabsl();
      if (lVar32 < local_64) {
        p_Var14 = (_List_node_base *)operator_new(0x18);
        plVar10 = local_e8;
        p_Var14[1]._M_next = p_Var21;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(plVar10->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Decompose_Cholesky",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Singular equation pivot ",0x19);
        poVar15 = std::operator<<((ostream *)&std::cout,(complex *)&local_108);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," k ",3);
        poVar15 = std::ostream::_M_insert<long>((long)poVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        lVar31 = (longdouble)1;
        local_108 = SUB104(lVar31,0);
        uStack_104 = (undefined4)((unkuint10)lVar31 >> 0x20);
        uStack_100 = (undefined2)((unkuint10)lVar31 >> 0x40);
        local_f8 = SUB108((longdouble)0,0);
        uStack_f0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
      }
      local_138._M_value._0_4_ = local_108;
      local_138._M_value._4_2_ = SUB42(uStack_104,0);
      local_138._M_value._6_2_ = SUB42((uint)uStack_104 >> 0x10,0);
      local_138._M_value._8_2_ = uStack_100;
      local_138._M_value._16_4_ = SUB84(local_f8,0);
      local_138._M_value._20_4_ = SUB84((ulong)local_f8 >> 0x20,0);
      local_138._M_value._24_2_ = uStack_f0;
      in_ST4 = in_ST3;
      csqrtl();
      pcVar25 = (this->fElem).fStore[(long)p_Var21];
      *(longdouble *)pcVar25->_M_value = lVar30;
      *(longdouble *)(pcVar25->_M_value + 0x10) = lVar29;
      local_f8 = *(undefined8 *)(pcVar25->_M_value + 0x10);
      uVar6 = *(undefined8 *)(pcVar25->_M_value + 0x18);
      uStack_f0 = (undefined2)uVar6;
      uStack_ee = (undefined4)((ulong)uVar6 >> 0x10);
      uStack_ea = (undefined2)((ulong)uVar6 >> 0x30);
      local_108 = *(undefined4 *)pcVar25->_M_value;
      uStack_104 = *(undefined4 *)(pcVar25->_M_value + 4);
      uStack_100 = (undefined2)*(undefined4 *)(pcVar25->_M_value + 8);
      uStack_fe = (undefined2)((uint)*(undefined4 *)(pcVar25->_M_value + 8) >> 0x10);
      uStack_fc = (undefined2)*(undefined4 *)(pcVar25->_M_value + 0xc);
      uStack_fa = (undefined2)((uint)*(undefined4 *)(pcVar25->_M_value + 0xc) >> 0x10);
      p_Var14 = (_List_node_base *)((long)&p_Var21->_M_next + 1);
      p_Var26 = p_Var21;
      if ((long)p_Var14 < (long)p_Var17) {
        lVar13 = 2;
        lVar22 = -0x40;
        lVar23 = 0x40;
        lVar31 = in_ST0;
        lVar28 = in_ST1;
        local_c0 = p_Var21;
        do {
          ppcVar4 = (this->fElem).fStore;
          lVar18 = (long)ppcVar4[(long)((long)&p_Var14->_M_next + 1)] - (long)ppcVar4[(long)p_Var14]
                   >> 5;
          in_ST0 = in_ST2;
          in_ST1 = in_ST3;
          if (lVar13 < lVar18) {
            ppcVar4 = (this->fElem).fStore;
            pcVar25 = ppcVar4[(long)p_Var14];
            local_a0 = lVar13 * 0x20;
            pcVar5 = ppcVar4[(long)p_Var26];
            pcVar24 = pcVar5 + 1;
            uVar16 = (ulong)((long)local_a8 - (long)pcVar24) >> 5;
            uVar12 = (uint)uVar16;
            uVar19 = (uint)((ulong)((long)ppcVar4[(long)((long)&p_Var21->_M_next + 2)] -
                                   (long)(pcVar25 + lVar13)) >> 5);
            if (uVar12 < uVar19) {
              uVar19 = uVar12;
            }
            local_b8 = lVar23;
            local_b0 = lVar22;
            local_98 = p_Var14;
            local_90 = lVar13;
            if (uVar19 != 0) {
              uVar20 = (ulong)((long)ppcVar4[(long)((long)&p_Var21->_M_next + 2)] +
                              (lVar22 - (long)pcVar25)) >> 5;
              if (uVar12 < (uint)uVar20) {
                uVar20 = uVar16;
              }
              uVar20 = uVar20 & 0xffffffff;
              lVar13 = 0;
              lVar32 = (longdouble)0;
              lVar30 = lVar32;
              do {
                local_88._0_10_ = *(unkbyte10 *)(pcVar24->_M_value + lVar13);
                local_88._16_10_ = -*(longdouble *)(pcVar5[1]._M_value + lVar13 + 0x10);
                uVar6 = *(undefined8 *)(pcVar25->_M_value + lVar13 + lVar23);
                uVar7 = *(undefined8 *)((long)(pcVar25->_M_value + lVar13 + lVar23) + 8);
                uVar8 = *(undefined8 *)(pcVar25->_M_value + lVar13 + lVar23 + 0x10);
                uVar9 = *(undefined8 *)((long)(pcVar25->_M_value + lVar13 + lVar23 + 0x10) + 8);
                local_138._M_value._0_4_ = SUB84(uVar6,0);
                local_138._M_value._4_2_ = SUB82((ulong)uVar6 >> 0x20,0);
                local_138._M_value._6_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                local_138._M_value._8_2_ = SUB82(uVar7,0);
                local_138._M_value._10_2_ = SUB82((ulong)uVar7 >> 0x10,0);
                local_138._M_value._12_4_ = SUB84((ulong)uVar7 >> 0x20,0);
                local_138._M_value._16_4_ = SUB84(uVar8,0);
                local_138._M_value._20_4_ = SUB84((ulong)uVar8 >> 0x20,0);
                local_138._M_value._24_2_ = SUB82(uVar9,0);
                local_138._M_value._26_2_ = SUB82((ulong)uVar9 >> 0x10,0);
                local_138._M_value._28_4_ = SUB84((ulong)uVar9 >> 0x20,0);
                local_114 = lVar30;
                local_dc = lVar32;
                std::complex<long_double>::operator*=(&local_138,(complex<long_double> *)local_88);
                lVar32 = (longdouble)
                         CONCAT28(local_138._M_value._8_2_,
                                  CONCAT26(local_138._M_value._6_2_,
                                           CONCAT24(local_138._M_value._4_2_,
                                                    local_138._M_value._0_4_))) + local_dc;
                lVar30 = (longdouble)
                         CONCAT28(local_138._M_value._24_2_,
                                  CONCAT44(local_138._M_value._20_4_,local_138._M_value._16_4_)) +
                         local_114;
                lVar13 = lVar13 + 0x20;
                uVar19 = (int)uVar20 - 1;
                uVar20 = (ulong)uVar19;
              } while (uVar19 != 0);
            }
            p_Var21 = local_98;
            lVar13 = local_a0;
            this = local_c8;
            pcVar25 = (local_c8->fElem).fStore[(long)local_98];
            local_138._M_value._4_2_ = *(undefined2 *)(pcVar25->_M_value + local_a0 + -0x12);
            local_138._M_value._0_4_ = *(undefined4 *)(pcVar25->_M_value + local_a0 + -0x16);
            local_88._4_2_ = *(undefined2 *)(pcVar25->_M_value + local_a0 + -2);
            local_88._0_4_ = *(undefined4 *)(pcVar25->_M_value + local_a0 + -6);
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            in_ST4 = in_ST1;
            __divxc3();
            pcVar25 = (this->fElem).fStore[(long)p_Var21];
            *(longdouble *)(pcVar25[-1]._M_value + lVar13) = lVar31;
            *(undefined4 *)(pcVar25->_M_value + lVar13 + -0x16) = local_138._M_value._0_4_;
            *(undefined2 *)(pcVar25->_M_value + lVar13 + -0x12) = local_138._M_value._4_2_;
            *(longdouble *)(pcVar25->_M_value + lVar13 + -0x10) = lVar28;
            *(undefined2 *)(pcVar25->_M_value + lVar13 + -2) = local_88._4_2_;
            *(undefined4 *)(pcVar25->_M_value + lVar13 + -6) = local_88._0_4_;
            lVar13 = local_90;
            lVar22 = local_b0;
            lVar23 = local_b8;
            p_Var17 = local_d0;
            p_Var26 = local_c0;
          }
          else {
            p_Var21 = p_Var14;
            in_ST0 = lVar31;
            in_ST1 = lVar28;
            if (lVar18 == lVar13) {
              pcVar25 = (this->fElem).fStore[(long)p_Var14];
              in_ST0 = in_ST2;
              in_ST1 = in_ST3;
              in_ST2 = in_ST3;
              in_ST4 = in_ST3;
              __divxc3();
              *(longdouble *)pcVar25[lVar13 + -1]._M_value = lVar31;
              *(longdouble *)(pcVar25[lVar13 + -1]._M_value + 0x10) = lVar28;
              this = local_c8;
              p_Var17 = local_d0;
              p_Var26 = local_c0;
            }
          }
          lVar13 = lVar13 + 1;
          p_Var14 = (_List_node_base *)((long)&p_Var21->_M_next + 1);
          lVar22 = lVar22 + -0x20;
          lVar23 = lVar23 + 0x20;
          lVar31 = in_ST0;
          lVar28 = in_ST1;
        } while ((long)p_Var14 < (long)p_Var17);
      }
      p_Var21 = (_List_node_base *)((long)&p_Var26->_M_next + 1);
    } while (p_Var21 != p_Var17);
  }
  lVar13 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  if (lVar13 != 0) {
    (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(local_58,this,lVar13 + -1);
    local_138._M_value._0_4_ = SUB104(local_58._0_10_,0);
    local_138._M_value._4_2_ = SUB102(local_58._0_10_,4);
    local_138._M_value._6_2_ = SUB102(local_58._0_10_,6);
    local_138._M_value._8_2_ = SUB102(local_58._0_10_,8);
    local_138._M_value._16_4_ = SUB104(local_58._16_10_,0);
    local_138._M_value._20_4_ = SUB104(local_58._16_10_,4);
    local_138._M_value._24_2_ = SUB102(local_58._16_10_,8);
    cabsl();
    local_114 = ABS(in_ST0);
    lVar31 = (longdouble)1e-15;
    local_138._M_value._0_4_ = SUB104(lVar31,0);
    local_138._M_value._4_2_ = SUB102((unkuint10)lVar31 >> 0x20,0);
    local_138._M_value._6_2_ = SUB102((unkuint10)lVar31 >> 0x30,0);
    local_138._M_value._8_2_ = SUB102((unkuint10)lVar31 >> 0x40,0);
    lVar31 = (longdouble)0;
    local_138._M_value._16_4_ = SUB104(lVar31,0);
    local_138._M_value._20_4_ = SUB104((unkuint10)lVar31 >> 0x20,0);
    local_138._M_value._24_2_ = SUB102((unkuint10)lVar31 >> 0x40,0);
    cabsl();
    if (local_114 < ABS(in_ST1)) {
      lVar13 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
      p_Var17 = (_List_node_base *)operator_new(0x18);
      plVar10 = local_e8;
      p_Var17[1]._M_next = (_List_node_base *)(lVar13 + -1);
      std::__detail::_List_node_base::_M_hook(p_Var17);
      psVar1 = &(plVar10->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      lVar13 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow + -1;
      lVar31 = (longdouble)1;
      local_138._M_value._0_4_ = SUB104(lVar31,0);
      local_138._M_value._4_2_ = SUB102((unkuint10)lVar31 >> 0x20,0);
      local_138._M_value._6_2_ = SUB102((unkuint10)lVar31 >> 0x30,0);
      local_138._M_value._8_2_ = SUB102((unkuint10)lVar31 >> 0x40,0);
      lVar31 = (longdouble)0;
      local_138._M_value._16_4_ = SUB104(lVar31,0);
      local_138._M_value._20_4_ = SUB104((unkuint10)lVar31 >> 0x20,0);
      local_138._M_value._24_2_ = SUB102((unkuint10)lVar31 >> 0x40,0);
      (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(this,lVar13,lVar13,&local_138);
    }
  }
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\x03';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\x01';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}